

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testgl.c
# Opt level: O3

int HandleEvent(SDL_Event *event)

{
  Uint8 UVar1;
  byte bVar2;
  undefined8 uVar3;
  char *pcVar4;
  int iVar5;
  bool bVar6;
  
  UVar1 = event->type;
  if (UVar1 == '\f') {
    return 1;
  }
  if (UVar1 != '\x02') {
    if (UVar1 != '\x01') {
      return 0;
    }
    pcVar4 = "gained";
    if ((event->active).gain == '\0') {
      pcVar4 = "lost";
    }
    printf("app %s ",pcVar4);
    bVar2 = (event->active).state;
    if ((bVar2 & 4) == 0) {
      if ((bVar2 & 1) == 0) {
        if ((bVar2 & 2) == 0) goto LAB_0010275e;
        pcVar4 = "input ";
      }
      else {
        pcVar4 = "mouse ";
      }
    }
    else {
      pcVar4 = "active ";
    }
    printf(pcVar4);
LAB_0010275e:
    puts("focus");
    return 0;
  }
  iVar5 = (event->resize).h;
  bVar6 = iVar5 == 0x1b;
  if (iVar5 == 0x67) {
    if (((event->key).keysym.mod & (KMOD_RCTRL|KMOD_LCTRL)) == KMOD_NONE) {
      iVar5 = 0x67;
      goto LAB_00102781;
    }
    HotKey_ToggleGrab();
    iVar5 = (event->resize).h;
  }
  if (iVar5 == 0x7a) {
    if (((event->key).keysym.mod & (KMOD_RCTRL|KMOD_LCTRL)) == KMOD_NONE) {
      iVar5 = 0x7a;
      goto LAB_00102781;
    }
    puts("Ctrl-Z: iconifying window!");
    SDL_WM_IconifyWindow();
    iVar5 = (event->resize).h;
  }
  if (iVar5 == 0xd) {
    if (((event->key).keysym.mod & (KMOD_RALT|KMOD_LALT)) == KMOD_NONE) {
      iVar5 = 0xd;
    }
    else {
      HotKey_ToggleFullScreen();
      iVar5 = (event->resize).h;
    }
  }
LAB_00102781:
  uVar3 = SDL_GetKeyName(iVar5);
  printf("key \'%s\' pressed\n",uVar3);
  return (uint)bVar6;
}

Assistant:

int HandleEvent(SDL_Event *event)
{
	int done;

	done = 0;
	switch( event->type ) {
	    case SDL_ACTIVEEVENT:
		/* See what happened */
		printf( "app %s ", event->active.gain ? "gained" : "lost" );
		if ( event->active.state & SDL_APPACTIVE ) {
			printf( "active " );
		} else if ( event->active.state & SDL_APPMOUSEFOCUS ) {
			printf( "mouse " );
		} else if ( event->active.state & SDL_APPINPUTFOCUS ) {
			printf( "input " );
		}
		printf( "focus\n" );
		break;
		

	    case SDL_KEYDOWN:
		if ( event->key.keysym.sym == SDLK_ESCAPE ) {
			done = 1;
		}
		if ( (event->key.keysym.sym == SDLK_g) &&
		     (event->key.keysym.mod & KMOD_CTRL) ) {
			HotKey_ToggleGrab();
		}
		if ( (event->key.keysym.sym == SDLK_z) &&
		     (event->key.keysym.mod & KMOD_CTRL) ) {
			HotKey_Iconify();
		}
		if ( (event->key.keysym.sym == SDLK_RETURN) &&
		     (event->key.keysym.mod & KMOD_ALT) ) {
			HotKey_ToggleFullScreen();
		}
		printf("key '%s' pressed\n", 
			SDL_GetKeyName(event->key.keysym.sym));
		break;
	    case SDL_QUIT:
		done = 1;
		break;
	}
	return(done);
}